

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

Block * __thiscall cfd::core::Block::operator=(Block *this,Block *object)

{
  uint32_t uVar1;
  
  if (this != object) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,
               &(object->data_).data_);
    (this->header_).version = (object->header_).version;
    BlockHash::operator=(&(this->header_).prev_block_hash,&(object->header_).prev_block_hash);
    BlockHash::operator=(&(this->header_).merkle_root_hash,&(object->header_).merkle_root_hash);
    uVar1 = (object->header_).bits;
    (this->header_).time = (object->header_).time;
    (this->header_).bits = uVar1;
    (this->header_).nonce = (object->header_).nonce;
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&this->txs_,&object->txs_);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator=
              (&this->txids_,&object->txids_);
  }
  return this;
}

Assistant:

Block& Block::operator=(const Block& object) {
  if (this != &object) {
    data_ = object.data_;
    header_ = object.header_;
    txs_ = object.txs_;
    txids_ = object.txids_;
  }
  return *this;
}